

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

substr __thiscall
c4::yml::Parser::_scan_plain_scalar_flow(Parser *this,csubstr currscalar,csubstr peeked_line)

{
  code *pcVar1;
  Location LVar2;
  undefined1 auVar3 [24];
  bool bVar4;
  int iVar5;
  size_t len_;
  pfn_error p_Var6;
  long lVar7;
  long lVar8;
  ulong len__00;
  void *pvVar9;
  char *pcVar10;
  basic_substring<const_char> *pbVar11;
  byte bVar12;
  uint uVar13;
  ro_substr chars;
  ro_substr chars_00;
  csubstr fmt;
  ro_substr chars_01;
  ro_substr chars_02;
  first_of_any_result fVar14;
  substr sVar15;
  basic_substring<char> bVar16;
  char msg [72];
  csubstr tpkl;
  basic_substring<const_char> local_108;
  basic_substring<const_char> local_f8;
  char *local_e8;
  char *pcStack_e0;
  basic_substring<const_char> local_d8 [3];
  char *local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  char *pcStack_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  char *pcStack_60;
  undefined8 local_58;
  basic_substring<const_char> local_50;
  basic_substring<char> local_40;
  
  local_a8 = currscalar.str;
  bVar12 = 0;
  chars.len = 7;
  chars.str = "[]{}?#,";
  local_108 = peeked_line;
  len_ = basic_substring<const_char>::first_of(&local_108,chars,0);
  if (len_ != 0) {
    bVar4 = true;
    do {
      uVar13 = this->m_state->flags;
      if ((~uVar13 & 0x44) == 0 || (uVar13 & 2) != 0) {
        local_f8 = basic_substring<const_char>::triml(&local_108,' ');
        chars_00.len = 2;
        chars_00.str = "\r\n";
        local_50 = basic_substring<const_char>::trimr(&local_f8,chars_00);
        if ((local_50.len < 2) || (*local_50.str != ':')) {
LAB_001e489e:
          iVar5 = basic_substring<const_char>::compare(&local_50,':');
          if (iVar5 != 0) {
            local_f8.len = 2;
            local_f8.str = ": ";
            local_e8 = ":";
            pcStack_e0 = (char *)0x1;
            fVar14 = basic_substring<char_const>::
                     first_of_any_iter<c4::basic_substring<char_const>*>
                               ((basic_substring<char_const> *)&local_108,&local_f8,local_d8);
            len__00 = fVar14.pos;
            if (len_ <= len__00 || fVar14.which == 0xffffffffffffffff) goto LAB_001e490d;
            if (local_108.len < len__00) {
              if (((s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
                pcVar1 = (code *)swi(3);
                sVar15 = (substr)(*pcVar1)();
                return sVar15;
              }
              handle_error(0x1ff947,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           ,0x154e,"num <= len || num == npos");
            }
            if (len__00 == 0xffffffffffffffff) {
              len__00 = local_108.len;
            }
            basic_substring<const_char>::basic_substring(&local_f8,local_108.str,len__00);
            local_108 = local_f8;
            if (local_f8.str + local_f8.len < (this->m_state->line_contents).rem.str) {
              pcVar10 = "check failed: (peeked_line.end() >= m_state->line_contents.rem.begin())";
              pbVar11 = &local_f8;
              for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
                pbVar11->str = *(char **)pcVar10;
                pcVar10 = pcVar10 + ((ulong)bVar12 * -2 + 1) * 8;
                pbVar11 = (basic_substring<const_char> *)&pbVar11[-(ulong)bVar12].len;
              }
              if (((s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
                pcVar1 = (code *)swi(3);
                sVar15 = (substr)(*pcVar1)();
                return sVar15;
              }
              p_Var6 = (this->m_stack).m_callbacks.m_error;
              local_78 = 0;
              uStack_70 = 0x7561;
              local_68 = 0;
              pcStack_60 = 
              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              ;
              local_58 = 0x65;
              pvVar9 = (this->m_stack).m_callbacks.m_user_data;
              uStack_70._0_4_ = 0x7561;
              uVar13 = (uint)uStack_70;
              goto LAB_001e4bd1;
            }
LAB_001e4be6:
            _line_progressed(this,(size_t)(local_108.str +
                                          (local_108.len -
                                          (long)(this->m_state->line_contents).rem.str)));
            break;
          }
        }
        else {
          lVar7 = 0;
          do {
            lVar8 = lVar7;
            if (lVar8 == 1) break;
            lVar7 = lVar8 + 1;
          } while (local_50.str[lVar8 + 1] == "\": "[lVar8 + 2]);
          if (lVar8 == 0) goto LAB_001e489e;
        }
        local_108.len = 0;
        break;
      }
LAB_001e490d:
      if (len_ != 0xffffffffffffffff) {
        if (local_108.len < len_) {
          if (((s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
            pcVar1 = (code *)swi(3);
            sVar15 = (substr)(*pcVar1)();
            return sVar15;
          }
          handle_error(0x1ff947,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1569,"pos <= len || pos == npos");
        }
        basic_substring<const_char>::basic_substring(&local_f8,local_108.str,len_);
        local_108 = local_f8;
        if (local_f8.str + local_f8.len < (this->m_state->line_contents).rem.str) {
          pcVar10 = "check failed: (peeked_line.end() >= m_state->line_contents.rem.begin())";
          pbVar11 = &local_f8;
          for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
            pbVar11->str = *(char **)pcVar10;
            pcVar10 = pcVar10 + ((ulong)bVar12 * -2 + 1) * 8;
            pbVar11 = (basic_substring<const_char> *)&pbVar11[-(ulong)bVar12].len;
          }
          if (((s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
            pcVar1 = (code *)swi(3);
            sVar15 = (substr)(*pcVar1)();
            return sVar15;
          }
          p_Var6 = (this->m_stack).m_callbacks.m_error;
          local_a0 = 0;
          uStack_98 = 0x756b;
          local_90 = 0;
          pcStack_88 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_80 = 0x65;
          pvVar9 = (this->m_stack).m_callbacks.m_user_data;
          uStack_98._0_4_ = 0x756b;
          uVar13 = (uint)uStack_98;
LAB_001e4bd1:
          auVar3 = ZEXT424(uVar13) << 0x40;
          LVar2.name.str._0_4_ = 0x1ff89a;
          LVar2.super_LineCol.offset = auVar3._0_8_;
          LVar2.super_LineCol.line = auVar3._8_8_;
          LVar2.super_LineCol.col = auVar3._16_8_;
          LVar2.name.str._4_4_ = 0;
          LVar2.name.len = 0x65;
          (*p_Var6)((char *)&local_f8,0x48,LVar2,pvVar9);
        }
        goto LAB_001e4be6;
      }
      if ((!bVar4) && (bVar4 = _advance_to_peeked(this), !bVar4)) {
        if (((s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
          pcVar1 = (code *)swi(3);
          sVar15 = (substr)(*pcVar1)();
          return sVar15;
        }
        local_f8 = (basic_substring<const_char>)(ZEXT816(0x7572) << 0x40);
        local_e8 = (char *)0x0;
        pcStack_e0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_d8[0].str = (char *)0x65;
        (*(code *)PTR_error_impl_00242518)
                  ("check failed: _advance_to_peeked()",0x22,
                   (anonymous_namespace)::s_default_callbacks);
      }
      local_108 = _scan_to_next_nonempty_line(this,0);
      if (local_108.str == (char *)0x0 || local_108.len == 0) {
        bVar4 = is_debugger_attached();
        if ((bVar4) && (bVar4 = is_debugger_attached(), bVar4)) {
          pcVar1 = (code *)swi(3);
          sVar15 = (substr)(*pcVar1)();
          return sVar15;
        }
        fmt.len = 0x25;
        fmt.str = "ERROR: expected token or continuation";
        _err<>(this,fmt);
      }
      bVar4 = false;
      chars_01.len = 7;
      chars_01.str = "[]{}?#,";
      len_ = basic_substring<const_char>::first_of(&local_108,chars_01,0);
    } while (len_ != 0);
  }
  basic_substring<char>::basic_substring
            (&local_40,local_a8,(this->m_buf).str + (this->m_state->pos).super_LineCol.offset);
  chars_02.len = 3;
  chars_02.str = "\n\r ";
  bVar16 = basic_substring<char>::trimr(&local_40,chars_02);
  sVar15.str = bVar16.str;
  sVar15.len = bVar16.len;
  return sVar15;
}

Assistant:

substr Parser::_scan_plain_scalar_flow(csubstr currscalar, csubstr peeked_line)
{
    static constexpr const csubstr chars = "[]{}?#,";
    size_t pos = peeked_line.first_of(chars);
    bool first = true;
    while(pos != 0)
    {
        if(has_all(RMAP|RKEY) || has_any(RUNK))
        {
            csubstr tpkl = peeked_line.triml(' ').trimr("\r\n");
            if(tpkl.begins_with(": ") || tpkl == ':')
            {
                _c4dbgpf("rscalar[FLOW]: map value starts on the peeked line: '{}'", peeked_line);
                peeked_line = peeked_line.first(0);
                break;
            }
            else
            {
                auto colon_pos = peeked_line.first_of_any(": ", ":");
                if(colon_pos && colon_pos.pos < pos)
                {
                    peeked_line = peeked_line.first(colon_pos.pos);
                    _c4dbgpf("rscalar[FLOW]: found colon at {}. peeked='{}'", colon_pos.pos, peeked_line);
                    _RYML_CB_ASSERT(m_stack.m_callbacks, peeked_line.end() >= m_state->line_contents.rem.begin());
                    _line_progressed(static_cast<size_t>(peeked_line.end() - m_state->line_contents.rem.begin()));
                    break;
                }
            }
        }
        if(pos != npos)
        {
            _c4dbgpf("rscalar[FLOW]: found special character '{}' at {}, stopping: '{}'", peeked_line[pos], pos, peeked_line.left_of(pos).trimr("\r\n"));
            peeked_line = peeked_line.left_of(pos);
            _RYML_CB_ASSERT(m_stack.m_callbacks, peeked_line.end() >= m_state->line_contents.rem.begin());
            _line_progressed(static_cast<size_t>(peeked_line.end() - m_state->line_contents.rem.begin()));
            break;
        }
        _c4dbgpf("rscalar[FLOW]: append another line, full: '{}'", peeked_line.trimr("\r\n"));
        if(!first)
        {
            RYML_CHECK(_advance_to_peeked());
        }
        peeked_line = _scan_to_next_nonempty_line(/*indentation*/0);
        if(peeked_line.empty())
        {
            _c4err("expected token or continuation");
        }
        pos = peeked_line.first_of(chars);
        first = false;
    }
    substr full(m_buf.str + (currscalar.str - m_buf.str), m_buf.begin() + m_state->pos.offset);
    full = full.trimr("\n\r ");
    return full;
}